

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O0

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::MapToNeighSide<double>
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,int side,int SideDim,TPZVec<double> *InternalPar,
          TPZVec<double> *NeighPar,TPZFMatrix<double> *JacNeighSide)

{
  bool bVar1;
  TPZFMatrix<double> *this_00;
  int64_t iVar2;
  int64_t iVar3;
  TPZVec<double> *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RDI;
  long *in_R8;
  long *in_R9;
  TPZTransform<double> tr;
  bool check;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<9,_double> JacSide;
  int in_stack_fffffffffffffccc;
  TPZGeoBlend<pzgeom::TPZGeoCube> *in_stack_fffffffffffffcd0;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffffce0;
  long *plVar4;
  int64_t in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  undefined1 uVar5;
  TPZSavable in_stack_fffffffffffffd00;
  TPZBaseMatrix local_110 [7];
  long *local_30;
  long *local_28;
  TPZVec<double> *local_20;
  int local_18;
  int local_14 [4];
  byte local_1;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  TPZFNMatrix<9,_double>::TPZFNMatrix(in_stack_fffffffffffffce0);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8
            );
  bVar1 = pztopology::TPZCube::CheckProjectionForSingularity<double>(local_14,local_20);
  uVar5 = bVar1;
  pztopology::TPZCube::MapToSide<double>
            (tr.fMult.super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec._4_4_,
             (TPZVec<double> *)tr.fMult.super_TPZFMatrix<double>.fSize,
             (TPZVec<double> *)tr.fMult.super_TPZFMatrix<double>.fGiven,
             (TPZFMatrix<double> *)tr.fMult.super_TPZFMatrix<double>.fElem);
  if (bVar1) {
    (**(code **)(*local_28 + 0x18))(local_28,(long)local_18);
    TPZTransform<double>::TPZTransform
              ((TPZTransform<double> *)CONCAT17(uVar5,in_stack_fffffffffffffcf0));
    TransfBetweenNeigh<double>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,(TPZTransform<double> *)0x1640f55
              );
    TPZTransform<double>::Apply
              ((TPZTransform<double> *)in_stack_fffffffffffffd00._vptr_TPZSavable,in_RDI,
               (TPZVec<double> *)CONCAT17(uVar5,in_stack_fffffffffffffcf0));
    (**(code **)(*local_30 + 0x68))(local_30,0);
    TransfBetweenNeigh<double>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,(TPZTransform<double> *)0x1640fa3
              );
    plVar4 = local_30;
    this_00 = TPZTransform<double>::Mult((TPZTransform<double> *)&stack0xfffffffffffffd00);
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)this_00);
    iVar3 = TPZBaseMatrix::Cols(local_110);
    (**(code **)(*plVar4 + 0x68))(plVar4,iVar2,iVar3);
    in_stack_fffffffffffffcd0 =
         (TPZGeoBlend<pzgeom::TPZGeoCube> *)
         TPZTransform<double>::Mult((TPZTransform<double> *)&stack0xfffffffffffffd00);
    (*(in_stack_fffffffffffffcd0->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.
      super_TPZCube.super_TPZSavable._vptr_TPZSavable[0x25])
              (in_stack_fffffffffffffcd0,local_110,local_30,0);
    local_1 = 1;
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x164104a);
  }
  else {
    local_1 = 0;
  }
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffcd0);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1641086);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool
    pzgeom::TPZGeoBlend<TGeo>::MapToNeighSide(int side, int SideDim, TPZVec<T> &InternalPar, TPZVec<T> &NeighPar,
                                              TPZFMatrix<T> &JacNeighSide) const {
        TPZFNMatrix<9, T> JacSide;

        TPZManVector<T, 3> SidePar(SideDim);
        const bool check = TGeo::CheckProjectionForSingularity(side, InternalPar);

        this->MapToSide(side, InternalPar, SidePar, JacSide);
        if (!check) {
            #ifdef PZ_LOG2
            td::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";
            sout << "\tmapping is not regular"<<std::endl;
            LOGPZ_DEBUG(logger,sout.str())
            #endif
            return false;
        }
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";

            sout << "SidePar: ";
            for(int i = 0; i < SidePar.NElements(); i++) sout << SidePar[i] << "\t";
            sout << "\n";

            JacSide.Print("JacSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        NeighPar.Resize(SideDim);
        TPZTransform<T> tr;
        TransfBetweenNeigh(side, tr);
        tr.Apply(SidePar, NeighPar);

        JacNeighSide.Resize(0, 0);
        TransfBetweenNeigh(side, tr);
        JacNeighSide.Resize(tr.Mult().Rows(), JacSide.Cols());
        tr.Mult().Multiply(JacSide, JacNeighSide);

#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            
            sout << "NeighPar: ";
            for(int i = 0; i < NeighPar.NElements(); i++) sout << NeighPar[i] << "\t";
            sout << "\n";
            
            JacNeighSide.Print("JacNeighSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        return true;
    }